

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

void EnsureNameValid(ON_wString *name)

{
  bool bVar1;
  int iVar2;
  wchar_t *pwVar3;
  wchar_t local_34;
  int local_30;
  wchar_t c;
  int i;
  int len;
  bool first;
  ON_wString local_18;
  ON_wString name_copy;
  ON_wString *name_local;
  
  name_copy.m_s = (wchar_t *)name;
  ON_wString::ON_wString(&local_18,name);
  ON_wString::operator=((ON_wString *)name_copy.m_s,L"");
  bVar1 = true;
  iVar2 = ON_wString::Length(&local_18);
  local_30 = 0;
  do {
    if (iVar2 <= local_30) {
      ON_wString::TrimLeftAndRight((ON_wString *)name_copy.m_s,(wchar_t *)0x0);
      ON_wString::~ON_wString(&local_18);
      return;
    }
    pwVar3 = ON_wString::operator[](&local_18,local_30);
    local_34 = *pwVar3;
    if (bVar1) {
      if ((((local_34 != L' ') && (local_34 != L'(')) && (local_34 != L')')) &&
         (((local_34 != L'[' && (local_34 != L']')) && ((local_34 != L'{' && (local_34 != L'}'))))))
      {
        bVar1 = false;
        goto LAB_00818ef4;
      }
    }
    else {
LAB_00818ef4:
      if (local_34 < L' ') {
        local_34 = L' ';
      }
      ON_wString::operator+=((ON_wString *)name_copy.m_s,local_34);
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static void EnsureNameValid(ON_wString& name)
{
  // 29th November 2023 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-78603
  // Component names cannot begin with '(', ')', '[', ']', '{', '}' or ' '.
  // Component names should not be multiline.
  // I'm also going to disallow ':' because that has a special meaning in the name and
  // render content does not use that feature.

  ON_wString name_copy = name;
  name = L"";

  bool first = true;
  const int len = name_copy.Length();
  for (int i = 0; i < len; i++)
  {
    wchar_t c = name_copy[i];
    if (first)
    {
      if ( c == L' '                ) continue;
      if ((c == L'(') || (c == L')')) continue;
      if ((c == L'[') || (c == L']')) continue;
      if ((c == L'{') || (c == L'}')) continue;

      first = false;
    }

    // Replace control codes with a space. Includes CR/LF.
    if (c < L' ')
      c = L' ';

    name += c;
  }

  // 2024-08-27 : kike@mcneel.com
  // `ON_ModelComponent::IsValidComponentName` allows ':'.
  // The hole point of https://mcneel.myjetbrains.com/youtrack/issue/RH-78603
  // is to ensure all type names has same restrictions.
  // 
  //// Also disallow ':' inside the name.
  //name.Replace(':', ' ');

  name.TrimLeftAndRight();
}